

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tx_search.c
# Opt level: O3

void block_rd_txfm(int plane,int block,int blk_row,int blk_col,BLOCK_SIZE plane_bsize,
                  TX_SIZE tx_size,void *arg)

{
  ENTROPY_CONTEXT *l;
  uint8_t *puVar1;
  MACROBLOCK *x;
  MB_MODE_INFO *pMVar2;
  AV1_COMP *cpi;
  bool bVar3;
  TX_PRUNE_TYPE TVar4;
  int16_t iVar5;
  int iVar6;
  int iVar7;
  ENTROPY_CONTEXT *a;
  long lVar8;
  byte bVar9;
  long lVar10;
  float fVar11;
  RD_STATS local_98;
  float score;
  TXB_CTX txb_ctx;
  
  if (*(int *)((long)arg + 0x88) != 0) {
    *(undefined4 *)((long)arg + 0x8c) = 1;
    return;
  }
  x = *(MACROBLOCK **)((long)arg + 8);
  pMVar2 = *(x->e_mbd).mi;
  if ((pMVar2->field_0xa7 & 0x80) == 0) {
    bVar3 = pMVar2->ref_frame[0] < '\x01';
  }
  else {
    bVar3 = false;
  }
  cpi = *arg;
  local_98.rate = 0;
  local_98.zero_rate = 0;
  local_98.dist = 0;
  local_98.rdcost = 0;
  local_98.sse = 0;
  local_98.skip_txfm = 1;
  if (bVar3) {
    av1_predict_intra_block_facade(&cpi->common,&x->e_mbd,plane,blk_col,blk_row,tx_size);
    av1_subtract_txb(x,plane,plane_bsize,blk_col,blk_row,tx_size);
    if ((x->txfm_search_params).enable_nn_prune_intra_tx_depths == true) {
      if (((((x->e_mbd).lossless[*(ushort *)&(*(x->e_mbd).mi)->field_0xa7 & 7] == 0) &&
           (txsize_to_bsize[tx_size] == plane_bsize)) && (tx_size == '\x01')) &&
         ((x->e_mbd).bd == 8)) {
        txb_ctx.txb_skip_ctx = 0;
        txb_ctx.dc_sign_ctx = 0;
        iVar6 = get_mean_dev_features
                          (x->plane[0].src_diff +
                           (long)blk_row * (ulong)block_size_wide[plane_bsize] * 4 +
                           (long)(blk_col * 4),(uint)block_size_wide[plane_bsize],8,8,
                           (float *)&txb_ctx);
        fVar11 = log1pf((float)x->source_variance);
        (&txb_ctx.txb_skip_ctx)[iVar6] = (int)fVar11;
        lVar10 = 0;
        iVar5 = av1_dc_quant_QTX(x->qindex,0,(x->e_mbd).bd);
        iVar7 = (int)iVar5 >> ((char)(x->e_mbd).bd - 8U & 0x1f);
        fVar11 = log1pf((float)(iVar7 * iVar7) * 0.00390625);
        (&txb_ctx.dc_sign_ctx)[iVar6] = (int)fVar11;
        do {
          *(float *)((long)&txb_ctx.txb_skip_ctx + lVar10) =
               (*(float *)((long)&txb_ctx.txb_skip_ctx + lVar10) -
               *(float *)((long)av1_intra_tx_split_8x8_mean + lVar10)) /
               *(float *)((long)av1_intra_tx_split_8x8_std + lVar10);
          lVar10 = lVar10 + 4;
        } while (lVar10 != 0x38);
        (*av1_nn_predict)((float *)&txb_ctx,&av1_intra_tx_split_nnconfig_8x8,1,&score);
        TVar4 = '\x02';
        if ((score <= -0.405465) || (TVar4 = '\x01', 0.405465 < score)) {
          (x->txfm_search_params).nn_prune_depths_for_intra_tx = TVar4;
        }
      }
      if ((x->txfm_search_params).nn_prune_depths_for_intra_tx == '\x01') {
        *(undefined8 *)((long)arg + 0x50) = 0x7fffffff;
        *(undefined8 *)((long)arg + 0x58) = 0x7fffffffffffffff;
        *(undefined8 *)((long)arg + 0x60) = 0x7fffffffffffffff;
        *(undefined8 *)((long)arg + 0x68) = 0x7fffffffffffffff;
        *(undefined1 *)((long)arg + 0x70) = 0;
        goto LAB_0024182e;
      }
    }
  }
  a = (ENTROPY_CONTEXT *)((long)arg + (long)blk_col + 0x10);
  l = (ENTROPY_CONTEXT *)((long)arg + (long)blk_row + 0x30);
  get_txb_ctx(plane_bsize,tx_size,plane,a,l,&txb_ctx);
  search_tx_type(cpi,x,plane,block,blk_row,blk_col,plane_bsize,tx_size,&txb_ctx,
                 *(FAST_TX_SEARCH_MODE *)((long)arg + 0x90),*(int *)((long)arg + 0x94),
                 *(long *)((long)arg + 0x80) - *(long *)((long)arg + 0x78),&local_98);
  if ((plane == 0) && ((x->e_mbd).cfl.store_y != 0)) {
    cfl_store_tx(&x->e_mbd,blk_row,blk_col,tx_size,plane_bsize);
  }
  bVar9 = x->plane[plane].txb_entropy_ctx[block];
  memset(a,(uint)bVar9,(long)tx_size_wide_unit[tx_size]);
  memset(l,(uint)bVar9,(long)tx_size_high_unit[tx_size]);
  iVar6 = (uint)(block_size_wide[plane_bsize] >> 2) * blk_row + blk_col;
  if (plane == 0) {
    (x->txfm_search_info).blk_skip[iVar6] =
         (x->txfm_search_info).blk_skip[iVar6] & 0xfe | x->plane[0].eobs[block] == 0;
  }
  else {
    puVar1 = (x->txfm_search_info).blk_skip + iVar6;
    *puVar1 = *puVar1 & ~(byte)(1L << ((byte)plane & 0x3f));
  }
  lVar10 = local_98.dist * 0x80 + ((long)x->rdmult * (long)local_98.rate + 0x100 >> 9);
  if (bVar3) {
    bVar9 = 0;
  }
  else {
    if (local_98.sse * 0x80 <= lVar10) {
      lVar10 = local_98.sse * 0x80;
    }
    bVar9 = x->plane[plane].eobs[block] == 0 & local_98.skip_txfm;
  }
  if (local_98.rate == 0x7fffffff || (long)*(int *)((long)arg + 0x50) == 0x7fffffff) {
    *(undefined8 *)((long)arg + 0x50) = 0x7fffffff;
    *(undefined8 *)((long)arg + 0x58) = 0x7fffffffffffffff;
    *(undefined8 *)((long)arg + 0x60) = 0x7fffffffffffffff;
    *(undefined8 *)((long)arg + 0x68) = 0x7fffffffffffffff;
    *(undefined1 *)((long)arg + 0x70) = 0;
  }
  else {
    lVar8 = (long)local_98.rate + (long)*(int *)((long)arg + 0x50);
    if (0x7ffffffe < lVar8) {
      lVar8 = 0x7fffffff;
    }
    *(int *)((long)arg + 0x50) = (int)lVar8;
    if (*(int *)((long)arg + 0x54) == 0) {
      *(int *)((long)arg + 0x54) = local_98.zero_rate;
    }
    *(long *)((long)arg + 0x58) = *(long *)((long)arg + 0x58) + local_98.dist;
    if ((*(long *)((long)arg + 0x68) != 0x7fffffffffffffff) && (local_98.sse != 0x7fffffffffffffff))
    {
      *(int64_t *)((long)arg + 0x68) = local_98.sse + *(long *)((long)arg + 0x68);
    }
    *(byte *)((long)arg + 0x70) = *(byte *)((long)arg + 0x70) & bVar9;
  }
  lVar10 = lVar10 + *(long *)((long)arg + 0x78);
  *(long *)((long)arg + 0x78) = lVar10;
  if (lVar10 <= *(long *)((long)arg + 0x80)) {
    return;
  }
LAB_0024182e:
  *(undefined4 *)((long)arg + 0x88) = 1;
  return;
}

Assistant:

static inline void block_rd_txfm(int plane, int block, int blk_row, int blk_col,
                                 BLOCK_SIZE plane_bsize, TX_SIZE tx_size,
                                 void *arg) {
  struct rdcost_block_args *args = arg;
  if (args->exit_early) {
    args->incomplete_exit = 1;
    return;
  }

  MACROBLOCK *const x = args->x;
  MACROBLOCKD *const xd = &x->e_mbd;
  const int is_inter = is_inter_block(xd->mi[0]);
  const AV1_COMP *cpi = args->cpi;
  ENTROPY_CONTEXT *a = args->t_above + blk_col;
  ENTROPY_CONTEXT *l = args->t_left + blk_row;
  const AV1_COMMON *cm = &cpi->common;
  RD_STATS this_rd_stats;
  av1_init_rd_stats(&this_rd_stats);

  if (!is_inter) {
    av1_predict_intra_block_facade(cm, xd, plane, blk_col, blk_row, tx_size);
    av1_subtract_txb(x, plane, plane_bsize, blk_col, blk_row, tx_size);
#if !CONFIG_REALTIME_ONLY
    const TxfmSearchParams *const txfm_params = &x->txfm_search_params;
    if (txfm_params->enable_nn_prune_intra_tx_depths) {
      ml_predict_intra_tx_depth_prune(x, blk_row, blk_col, plane_bsize,
                                      tx_size);
      if (txfm_params->nn_prune_depths_for_intra_tx == TX_PRUNE_LARGEST) {
        av1_invalid_rd_stats(&args->rd_stats);
        args->exit_early = 1;
        return;
      }
    }
#endif
  }

  TXB_CTX txb_ctx;
  get_txb_ctx(plane_bsize, tx_size, plane, a, l, &txb_ctx);
  search_tx_type(cpi, x, plane, block, blk_row, blk_col, plane_bsize, tx_size,
                 &txb_ctx, args->ftxs_mode, args->skip_trellis,
                 args->best_rd - args->current_rd, &this_rd_stats);

#if !CONFIG_REALTIME_ONLY
  if (plane == AOM_PLANE_Y && xd->cfl.store_y) {
    assert(!is_inter || plane_bsize < BLOCK_8X8);
    cfl_store_tx(xd, blk_row, blk_col, tx_size, plane_bsize);
  }
#endif

#if CONFIG_RD_DEBUG
  update_txb_coeff_cost(&this_rd_stats, plane, this_rd_stats.rate);
#endif  // CONFIG_RD_DEBUG
  av1_set_txb_context(x, plane, block, tx_size, a, l);

  const int blk_idx =
      blk_row * (block_size_wide[plane_bsize] >> MI_SIZE_LOG2) + blk_col;

  TxfmSearchInfo *txfm_info = &x->txfm_search_info;
  if (plane == 0)
    set_blk_skip(txfm_info->blk_skip, plane, blk_idx,
                 x->plane[plane].eobs[block] == 0);
  else
    set_blk_skip(txfm_info->blk_skip, plane, blk_idx, 0);

  int64_t rd;
  if (is_inter) {
    const int64_t no_skip_txfm_rd =
        RDCOST(x->rdmult, this_rd_stats.rate, this_rd_stats.dist);
    const int64_t skip_txfm_rd = RDCOST(x->rdmult, 0, this_rd_stats.sse);
    rd = AOMMIN(no_skip_txfm_rd, skip_txfm_rd);
    this_rd_stats.skip_txfm &= !x->plane[plane].eobs[block];
  } else {
    // Signal non-skip_txfm for Intra blocks
    rd = RDCOST(x->rdmult, this_rd_stats.rate, this_rd_stats.dist);
    this_rd_stats.skip_txfm = 0;
  }

  av1_merge_rd_stats(&args->rd_stats, &this_rd_stats);

  args->current_rd += rd;
  if (args->current_rd > args->best_rd) args->exit_early = 1;
}